

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O0

void __thiscall
r_exec::View::View(View *this,SyncMode sync,uint64_t ijt,double sln,int64_t res,Code *destination,
                  Code *origin,Code *object,double act)

{
  Atom *pAVar1;
  Atom local_5c [4];
  Atom local_58 [16];
  double local_48;
  double act_local;
  Code *origin_local;
  Code *destination_local;
  int64_t res_local;
  double sln_local;
  uint64_t ijt_local;
  View *pVStack_10;
  SyncMode sync_local;
  View *this_local;
  
  local_48 = act;
  act_local = (double)origin;
  origin_local = destination;
  destination_local = (Code *)res;
  res_local = (int64_t)sln;
  sln_local = (double)ijt;
  ijt_local._4_4_ = sync;
  pVStack_10 = this;
  r_code::View::View(&this->super_View);
  (this->super_View).super__Object._vptr__Object = (_func_int **)&PTR__View_002ed5f8;
  core::P<r_exec::Controller>::P(&this->controller,(Controller *)0x0);
  std::mutex::mutex(&this->m_groupMutex);
  r_code::Atom::SSet((ushort)local_58,(uchar)Opcodes::PgmView);
  pAVar1 = r_code::View::code(&this->super_View,0);
  r_code::Atom::operator=(pAVar1,local_58);
  r_code::Atom::~Atom(local_58);
  init(this,(EVP_PKEY_CTX *)(ulong)ijt_local._4_4_);
  r_code::Atom::Float((float)local_48);
  pAVar1 = r_code::View::code(&this->super_View,7);
  r_code::Atom::operator=(pAVar1,local_5c);
  r_code::Atom::~Atom(local_5c);
  return;
}

Assistant:

View::View(SyncMode sync,
           uint64_t ijt,
           double sln,
           int64_t res,
           Code *destination,
           Code *origin,
           Code *object,
           double act): r_code::View(), controller(nullptr)
{
    code(VIEW_OPCODE) = Atom::SSet(Opcodes::PgmView, PGM_VIEW_ARITY);
    init(sync, ijt, sln, res, destination, origin, object);
    code(VIEW_ACT) = Atom::Float(act);
}